

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

optional<pbrt::Bounds2<int>_> * __thiscall
pstd::optional<pbrt::Bounds2<int>_>::operator=(optional<pbrt::Bounds2<int>_> *this,Bounds2<int> *v)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  
  reset(this);
  TVar1 = (v->pMax).super_Tuple2<pbrt::Point2,_int>;
  *(Tuple2<pbrt::Point2,_int> *)&this->optionalValue = (v->pMin).super_Tuple2<pbrt::Point2,_int>;
  *(Tuple2<pbrt::Point2,_int> *)((long)&this->optionalValue + 8) = TVar1;
  this->set = true;
  return this;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(T &&v) {
        reset();
        new (ptr()) T(std::move(v));
        set = true;
        return *this;
    }